

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_geometry_device.cpp
# Opt level: O1

void device_init(char *cfg)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18;
  
  embree::data = (RTCScene)0x0;
  _DAT_002ced30 = 0;
  DAT_002ced38 = embree::alignedUSMMalloc(0x2000,0x10,DEVICE_READ_ONLY);
  embree::g_scene = (RTCScene)rtcNewScene(g_device);
  embree::data = embree::g_scene;
  embree::addGroundPlane(embree::g_scene);
  local_18._0_8_ = 0;
  local_18._8_8_ = 0;
  embree::addPoints(embree::g_scene,RTC_GEOMETRY_TYPE_SPHERE_POINT,(Vec3fa *)&local_18.field_1);
  local_18._0_8_ = 0x40a00000;
  local_18._8_8_ = 0;
  embree::addPoints(embree::g_scene,RTC_GEOMETRY_TYPE_DISC_POINT,(Vec3fa *)&local_18.field_1);
  local_18._0_8_ = 0xc0a00000;
  local_18._8_8_ = 0;
  embree::addPoints(embree::g_scene,RTC_GEOMETRY_TYPE_ORIENTED_DISC_POINT,
                    (Vec3fa *)&local_18.field_1);
  rtcCommitScene(embree::g_scene);
  _DAT_002ced30 = rtcGetSceneTraversable(embree::data);
  return;
}

Assistant:

void device_init (char* cfg)
{
  /* create scene */
  TutorialData_Constructor(&data);
  g_scene = data.g_scene = rtcNewScene(g_device);

  /* add ground plane */
  addGroundPlane(g_scene);

  /* add curve */
  addPoints(g_scene, RTC_GEOMETRY_TYPE_SPHERE_POINT,        Vec3fa( 0.0f, 0.0f, 0.0f));
  addPoints(g_scene, RTC_GEOMETRY_TYPE_DISC_POINT,          Vec3fa( 5.0f, 0.0f, 0.0f));
  addPoints(g_scene, RTC_GEOMETRY_TYPE_ORIENTED_DISC_POINT, Vec3fa(-5.0f, 0.0f, 0.0f));

  /* commit changes to scene */
  rtcCommitScene (g_scene);
  data.g_traversable = rtcGetSceneTraversable(data.g_scene);
}